

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall QWidgetWindow::~QWidgetWindow(QWidgetWindow *this)

{
  Data *pDVar1;
  QWidgetPrivate *this_00;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var2;
  QBackingStore *this_01;
  long *plVar3;
  long *plVar4;
  pointer *__ptr;
  long *plVar5;
  
  *(undefined ***)this = &PTR_metaObject_007f61c8;
  *(undefined ***)&this->field_0x10 = &PTR__QWidgetWindow_007f6300;
  QWindow::destroy();
  pDVar1 = (this->m_widget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->m_widget).wp.value != (QObject *)0x0)) {
    this_00 = *(QWidgetPrivate **)((this->m_widget).wp.value + 8);
    QWidgetPrivate::createTLExtra(this_00);
    _Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
         (((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
         super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    std::__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::reset
              ((__uniq_ptr_impl<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                *)((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                         _M_t.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                         super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 8),(pointer)0x0);
    this_01 = *(QBackingStore **)
               ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x10);
    if (this_01 != (QBackingStore *)0x0) {
      QBackingStore::~QBackingStore(this_01);
      operator_delete(this_01,8);
    }
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x10) = 0;
    plVar3 = *(long **)((long)_Var2.
                              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t
                              .super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 200);
    plVar4 = *(long **)((long)_Var2.
                              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t
                              .super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0);
    plVar5 = plVar3;
    if (plVar4 != plVar3) {
      do {
        if ((long *)*plVar5 != (long *)0x0) {
          (**(code **)(*(long *)*plVar5 + 0x20))();
        }
        *plVar5 = 0;
        plVar5 = plVar5 + 1;
      } while (plVar5 != plVar4);
      *(long **)((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                       super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0) = plVar3;
    }
    *(undefined8 *)
     ((long)_Var2.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20) = 0;
  }
  pDVar1 = (this->m_dragTarget).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if ((*(int *)pDVar1 == 0) && (pDVar1 = (this->m_dragTarget).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  pDVar1 = (this->m_implicit_mouse_grabber).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if ((*(int *)pDVar1 == 0) &&
       (pDVar1 = (this->m_implicit_mouse_grabber).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  pDVar1 = (this->m_widget).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if ((*(int *)pDVar1 == 0) && (pDVar1 = (this->m_widget).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  QWindow::~QWindow(&this->super_QWindow);
  return;
}

Assistant:

QWidgetWindow::~QWidgetWindow()
{
    // destroy while we are still alive
    destroy();

    if (!m_widget)
        return;

    QTLWExtra *topData = QWidgetPrivate::get(m_widget)->topData();
    Q_ASSERT(topData);

    // The QPlaformBackingStore may hold a reference to the window,
    // so the backingstore needs to be deleted first.
    topData->repaintManager.reset(nullptr);
    delete topData->backingStore;
    topData->backingStore = nullptr;
    topData->widgetTextures.clear();

    // Too late to do anything beyond this point
    topData->window = nullptr;
}